

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O0

void LLVMConsumeError(LLVMErrorRef Err)

{
  Error local_18;
  LLVMErrorRef local_10;
  LLVMErrorRef Err_local;
  
  local_10 = Err;
  llvm::unwrap((llvm *)&local_18,Err);
  llvm::consumeError(&local_18);
  llvm::Error::~Error(&local_18);
  return;
}

Assistant:

void LLVMConsumeError(LLVMErrorRef Err) { consumeError(unwrap(Err)); }